

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_coding.cc
# Opt level: O1

void __thiscall
s2shapeutil::TaggedShapeFactory::TaggedShapeFactory
          (TaggedShapeFactory *this,ShapeDecoder *shape_decoder,Decoder *decoder)

{
  bool bVar1;
  
  (this->super_ShapeFactory)._vptr_ShapeFactory = (_func_int **)&PTR__TaggedShapeFactory_002c3130;
  std::function<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_(unsigned_int,_Decoder_*)>::
  function(&this->shape_decoder_,shape_decoder);
  bVar1 = s2coding::EncodedStringVector::Init(&this->encoded_shapes_,decoder);
  if (!bVar1) {
    (this->encoded_shapes_).offsets_.size_ = 0;
    (this->encoded_shapes_).offsets_.data_ = (char *)0x0;
    (this->encoded_shapes_).data_ = (char *)0x0;
  }
  return;
}

Assistant:

TaggedShapeFactory::TaggedShapeFactory(const ShapeDecoder& shape_decoder,
                                       Decoder* decoder)
    : shape_decoder_(shape_decoder) {
  if (!encoded_shapes_.Init(decoder)) encoded_shapes_.Clear();
}